

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O0

void __thiscall
wallet::init_tests::walletinit_verify_walletdir_default::test_method
          (walletinit_verify_walletdir_default *this)

{
  bool bVar1;
  pointer pWVar2;
  char *__s;
  mapped_type *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  bool result;
  path expected_path;
  path walletdir;
  path *in_stack_fffffffffffffd58;
  lazy_ostream *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  key_type *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  lazy_ostream *in_stack_fffffffffffffd88;
  const_string *in_stack_fffffffffffffd90;
  const_string *file;
  allocator<char> *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  ArgsManager *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [56];
  lazy_ostream local_168 [2];
  assertion_result local_148 [2];
  path local_e8;
  lazy_ostream local_c0 [2];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
                *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78);
  InitWalletDirTestingSetup::SetWalletDir
            ((InitWalletDirTestingSetup *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
             (path *)in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(&in_stack_fffffffffffffd58->_M_pathname);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  pWVar2 = std::unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
           ::operator->((unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
                         *)in_stack_fffffffffffffd58);
  (*(pWVar2->super_ChainClient)._vptr_ChainClient[3])();
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)in_stack_fffffffffffffd60,(unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
               (size_t)in_stack_fffffffffffffd88,
               (const_string *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffd68,
               SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)in_stack_fffffffffffffd60,(unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffd60,(basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)in_stack_fffffffffffffd60,(unsigned_long)in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd58 = (path *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_148,local_168,(const_string *)&stack0xfffffffffffffe78,0x14,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_78 = 0;
  fs::path::path((path *)in_stack_fffffffffffffd58);
  ArgsManager::GetPathArg
            (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,(path *)in_stack_fffffffffffffd98);
  fs::path::~path((path *)in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(&in_stack_fffffffffffffd58->_M_pathname);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe77);
  __s = (char *)(in_RDI + 0x488);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffe76;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffffd98);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                         in_stack_fffffffffffffd78);
  std::filesystem::canonical(&local_e8);
  fs::path::path((path *)in_stack_fffffffffffffd58,(path *)0xdb26ae);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(&in_stack_fffffffffffffd58->_M_pathname);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe76);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)in_stack_fffffffffffffd60,(unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file,(size_t)in_stack_fffffffffffffd88,
               (const_string *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    in_stack_fffffffffffffd88 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffd60,(char (*) [1])in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,
               (pointer)in_stack_fffffffffffffd60,(unsigned_long)in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd68 = "expected_path";
    in_stack_fffffffffffffd60 = local_c0;
    in_stack_fffffffffffffd58 = (path *)0x1cd8db0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1d0,local_1e0,0x17,1,2,local_50);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd87 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd87);
  fs::path::~path((path *)in_stack_fffffffffffffd58);
  fs::path::~path((path *)in_stack_fffffffffffffd58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_default)
{
    SetWalletDir(m_walletdir_path_cases["default"]);
    bool result = m_wallet_loader->verify();
    BOOST_CHECK(result == true);
    fs::path walletdir = m_args.GetPathArg("-walletdir");
    fs::path expected_path = fs::canonical(m_walletdir_path_cases["default"]);
    BOOST_CHECK_EQUAL(walletdir, expected_path);
}